

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperationProcessing.hpp
# Opt level: O0

bool isComparisonOperation(string *op)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_123;
  undefined1 local_122;
  allocator<char> local_121;
  allocator<char> local_120;
  allocator<char> local_11f;
  allocator<char> local_11e;
  allocator<char> local_11d [20];
  allocator<char> local_109;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  string local_e0 [32];
  string local_c0 [32];
  string local_a0 [32];
  string local_80 [32];
  string local_60 [32];
  undefined1 local_40 [40];
  string *local_18;
  string *op_local;
  
  local_122 = 1;
  local_108 = &local_100;
  local_18 = op;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_100,"==",&local_109);
  local_108 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_e0,"!=",local_11d);
  local_108 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_c0,">=",&local_11e);
  local_108 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_a0,"<=",&local_11f);
  local_108 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_80,">",&local_120);
  local_108 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_60,"<",&local_121);
  local_122 = 0;
  local_40._0_8_ = &local_100;
  local_40._8_8_ = 6;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_123);
  __l._M_len = local_40._8_8_;
  __l._M_array = (iterator)local_40._0_8_;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)(local_40 + 0x10),__l,&local_123);
  std::__cxx11::string::string((string *)&local_148,op);
  op_local._7_1_ =
       contain<std::__cxx11::string>
                 ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(local_40 + 0x10),&local_148);
  std::__cxx11::string::~string((string *)&local_148);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_40 + 0x10));
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_123);
  local_1c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40;
  do {
    local_1c8 = local_1c8 + -1;
    std::__cxx11::string::~string((string *)local_1c8);
  } while (local_1c8 != &local_100);
  std::allocator<char>::~allocator(&local_121);
  std::allocator<char>::~allocator(&local_120);
  std::allocator<char>::~allocator(&local_11f);
  std::allocator<char>::~allocator(&local_11e);
  std::allocator<char>::~allocator(local_11d);
  std::allocator<char>::~allocator(&local_109);
  return (bool)(op_local._7_1_ & 1);
}

Assistant:

bool isComparisonOperation(string op) {
	return contain({"==", "!=", ">=", "<=", ">", "<"}, op);
}